

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeAddExceptions(Unicode61Tokenizer *p,char *z,int bTokenChars)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  uint local_40;
  
  sVar6 = strlen(z);
  uVar4 = (uint)sVar6;
  if (0 < (int)uVar4) {
    piVar7 = p->aiException;
    iVar2 = p->nException;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      piVar7 = (int *)sqlite3Realloc(piVar7,((long)iVar2 + (long)(int)uVar4) * 4);
    }
    else {
      piVar7 = (int *)0x0;
    }
    if (piVar7 == (int *)0x0) {
      return 7;
    }
    local_40 = p->nException;
    if ((sVar6 & 0x7fffffff) != 0) {
      pbVar10 = (byte *)(z + (uVar4 & 0x7fffffff));
      do {
        bVar1 = *z;
        uVar9 = (ulong)bVar1;
        z = (char *)((byte *)z + 1);
        if (0xbf < bVar1) {
          uVar4 = (uint)""[bVar1 - 0xc0];
          for (; (z < pbVar10 && (((byte)*z & 0xffffffc0) == 0x80)); z = (char *)((byte *)z + 1)) {
            uVar4 = uVar4 << 6 | (byte)*z & 0x3f;
          }
          uVar9 = (ulong)uVar4;
          if ((uVar4 & 0xfffff800) == 0xd800) {
            uVar9 = 0xfffd;
          }
          if (uVar4 < 0x80) {
            uVar9 = 0xfffd;
          }
          if ((uVar4 & 0xfffffffe) == 0xfffe) {
            uVar9 = 0xfffd;
          }
        }
        uVar4 = (uint)uVar9;
        if (uVar4 < 0x80) {
          p->aTokenChar[uVar9] = (uchar)bTokenChars;
        }
        else {
          uVar5 = sqlite3Fts5UnicodeCategory(uVar4);
          if ((uint)p->aCategory[uVar5] != bTokenChars) {
            uVar5 = 0;
            if (0xffffffcd < uVar4 - 0x332) {
              uVar5 = 1 << ((byte)uVar9 & 0x1f);
              if ((int)uVar4 < 800) {
                uVar5 = uVar5 & 0x8029fdf;
              }
              else {
                uVar5 = uVar5 & 0x361f8;
              }
            }
            if (uVar5 == 0) {
              if ((int)local_40 < 1) {
                uVar9 = 0;
              }
              else {
                uVar8 = 0;
                do {
                  uVar9 = uVar8;
                  if (uVar4 < (uint)piVar7[uVar8]) break;
                  uVar8 = uVar8 + 1;
                  uVar9 = (ulong)local_40;
                } while (local_40 != uVar8);
              }
              memmove(piVar7 + (uVar9 & 0xffffffff) + 1,piVar7 + (uVar9 & 0xffffffff),
                      (long)(int)(local_40 - (int)uVar9) << 2);
              piVar7[uVar9 & 0xffffffff] = uVar4;
              local_40 = local_40 + 1;
            }
          }
        }
      } while (z < pbVar10);
    }
    p->aiException = piVar7;
    p->nException = local_40;
  }
  return 0;
}

Assistant:

static int fts5UnicodeAddExceptions(
  Unicode61Tokenizer *p,          /* Tokenizer object */
  const char *z,                  /* Characters to treat as exceptions */
  int bTokenChars                 /* 1 for 'tokenchars', 0 for 'separators' */
){
  int rc = SQLITE_OK;
  int n = (int)strlen(z);
  int *aNew;

  if( n>0 ){
    aNew = (int*)sqlite3_realloc64(p->aiException,
                                   (n+p->nException)*sizeof(int));
    if( aNew ){
      int nNew = p->nException;
      const unsigned char *zCsr = (const unsigned char*)z;
      const unsigned char *zTerm = (const unsigned char*)&z[n];
      while( zCsr<zTerm ){
        u32 iCode;
        int bToken;
        READ_UTF8(zCsr, zTerm, iCode);
        if( iCode<128 ){
          p->aTokenChar[iCode] = (unsigned char)bTokenChars;
        }else{
          bToken = p->aCategory[sqlite3Fts5UnicodeCategory(iCode)];
          assert( (bToken==0 || bToken==1) );
          assert( (bTokenChars==0 || bTokenChars==1) );
          if( bToken!=bTokenChars && sqlite3Fts5UnicodeIsdiacritic(iCode)==0 ){
            int i;
            for(i=0; i<nNew; i++){
              if( (u32)aNew[i]>iCode ) break;
            }
            memmove(&aNew[i+1], &aNew[i], (nNew-i)*sizeof(int));
            aNew[i] = iCode;
            nNew++;
          }
        }
      }
      p->aiException = aNew;
      p->nException = nNew;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}